

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexEssentialBitOne(Gia_Man_t *p,Abc_Cex_t *pCexState,int iBit,Abc_Cex_t *pCexPrev,int *pfEqual)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  Abc_Cex_t *p_00;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int local_60;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x289,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (iBit < pCexState->nBits) {
    if (pfEqual != (int *)0x0) {
      *pfEqual = 0;
    }
    p_00 = Abc_CexAllocFull(0,p->vCis->nSize,pCexState->iFrame + 1);
    iVar8 = pCexState->iFrame;
    p_00->iPo = pCexState->iPo;
    p_00->iFrame = iVar8;
    (&p_00[1].iPo)[iBit >> 5] = (&p_00[1].iPo)[iBit >> 5] ^ 1 << ((byte)iBit & 0x1f);
    *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
    *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
    uVar13 = (long)iBit / (long)pCexState->nPis;
    uVar6 = uVar13 & 0xffffffff;
    local_60 = (int)uVar13;
    do {
      local_60 = local_60 + 1;
      iVar8 = (int)uVar6;
      if (pCexState->iFrame < iVar8) {
        return p_00;
      }
      iVar7 = 0;
      while ((iVar7 < p->vCis->nSize && (pGVar3 = Gia_ManCi(p,iVar7), pGVar3 != (Gia_Obj_t *)0x0)))
      {
        iVar4 = pCexState->nPis * iVar8 + iVar7;
        uVar6 = (ulong)(((uint)(&pCexState[1].iPo)[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) & 1) << 0x1e)
        ;
        uVar13 = *(ulong *)pGVar3;
        *(ulong *)pGVar3 = uVar13 & 0xffffffffbfffffff | uVar6;
        uVar5 = pCexState->nPis * iVar8 + iVar7;
        *(ulong *)pGVar3 =
             uVar13 & 0xbfffffffbfffffff | uVar6 |
             (ulong)(((uint)(&p_00[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) << 0x3e;
        iVar7 = iVar7 + 1;
      }
      iVar7 = 0;
      while ((iVar7 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
        uVar13 = *(ulong *)pGVar3;
        uVar6 = uVar13 & 0x1fffffff;
        if (uVar6 != 0x1fffffff && -1 < (int)uVar13) {
          pGVar1 = pGVar3 + -uVar6;
          uVar11 = (uint)(uVar13 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -uVar6) >> 0x1e;
          uVar5 = (uint)(uVar13 >> 0x20);
          uVar6 = (ulong)(uVar5 & 0x1fffffff);
          pGVar9 = pGVar3 + -uVar6;
          uVar12 = *(uint *)(pGVar3 + -uVar6) >> 0x1e & 1;
          uVar5 = uVar5 >> 0x1d & 1;
          uVar14 = (uVar12 ^ uVar5) & uVar11;
          uVar6 = (ulong)(uVar14 << 0x1e);
          *(ulong *)pGVar3 = uVar13 & 0xffffffff3fffffff | uVar6;
          if (uVar14 == 0) {
            if (((uVar11 & 1) == 0) && (uVar12 == uVar5)) {
              uVar13 = uVar13 & 0xbfffffff3fffffff |
                       (*(ulong *)pGVar9 | *(ulong *)pGVar1) & 0x4000000000000000;
            }
            else if ((uVar11 & 1) == 0) {
              uVar13 = uVar13 & 0xbfffffff3fffffff | *(ulong *)pGVar1 & 0x4000000000000000;
            }
            else {
              if (uVar12 != uVar5) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                              ,0x2aa,
                              "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                             );
              }
              uVar13 = uVar13 & 0xbfffffff3fffffff | *(ulong *)pGVar9 & 0x4000000000000000;
            }
          }
          else {
            uVar13 = uVar13 & 0xbfffffff3fffffff | uVar6 |
                     *(ulong *)pGVar1 & 0x4000000000000000 & *(ulong *)pGVar9;
          }
          *(ulong *)pGVar3 = uVar13;
        }
        iVar7 = iVar7 + 1;
      }
      iVar7 = 0;
      while ((iVar7 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar7), pGVar3 != (Gia_Obj_t *)0x0)))
      {
        uVar13 = *(ulong *)pGVar3;
        uVar6 = (ulong)((uint)uVar13 & 0x1fffffff);
        uVar10 = (ulong)(((uint)uVar13 * 2 ^ *(uint *)(pGVar3 + -uVar6)) & 0x40000000);
        *(ulong *)pGVar3 = uVar13 & 0xffffffffbfffffff | uVar10;
        *(ulong *)pGVar3 =
             uVar13 & 0xbfffffffbfffffff | uVar10 | *(ulong *)(pGVar3 + -uVar6) & 0x4000000000000000
        ;
        iVar7 = iVar7 + 1;
      }
      if (iVar8 < pCexState->iFrame) {
        iVar7 = p->nRegs;
        iVar4 = (pCexState->nPis * local_60 + p->vCis->nSize) - iVar7;
        iVar15 = 0;
        bVar2 = false;
        uVar5 = (uint)(pCexPrev != (Abc_Cex_t *)0x0);
        while ((iVar15 < iVar7 &&
               (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - iVar7) + iVar15), pGVar3 != (Gia_Obj_t *)0x0)
               )) {
          if ((pCexPrev != (Abc_Cex_t *)0x0) && (uVar5 != 0)) {
            iVar7 = iVar4 + iVar15;
            uVar5 = ~((uint)(&pCexPrev[1].iPo)[iVar7 >> 5] >> ((byte)iVar7 & 0x1f) ^
                     (uint)(*(ulong *)pGVar3 >> 0x3e)) & 1;
          }
          if ((*(ulong *)pGVar3 & 0x4000000000000000) == 0) {
            iVar7 = iVar4 + iVar15;
            bVar2 = true;
            (&p_00[1].iPo)[iVar7 >> 5] = (&p_00[1].iPo)[iVar7 >> 5] ^ 1 << ((byte)iVar7 & 0x1f);
          }
          iVar15 = iVar15 + 1;
          iVar7 = p->nRegs;
        }
        if ((!bVar2) || (uVar5 != 0)) {
          if (pfEqual != (int *)0x0) {
            *pfEqual = uVar5;
          }
          Abc_CexFree(p_00);
          return (Abc_Cex_t *)0x0;
        }
      }
      uVar6 = (ulong)(iVar8 + 1);
    } while( true );
  }
  __assert_fail("iBit < pCexState->nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                ,0x28a,
                "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
               );
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBitOne( Gia_Man_t * p, Abc_Cex_t * pCexState, int iBit, Abc_Cex_t * pCexPrev, int * pfEqual )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    assert( pCexState->nRegs == 0 );
    assert( iBit < pCexState->nBits );
    if ( pfEqual )
        *pfEqual = 0;
    // start the counter-example
    pNew = Abc_CexAllocFull( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // clean bit
    Abc_InfoXorBit( pNew->pData, iBit );
    // simulate the remaining frames
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = iBit / pCexState->nPis; i <= pCexState->iFrame; i++ )
    {
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCexState->pData, i * pCexState->nPis + k );
            pObj->fMark1 = Abc_InfoHasBit( pNew->pData,      i * pCexState->nPis + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }
        if ( i < pCexState->iFrame )
        {
            int fChanges  = 0;
            int fEqual    = (pCexPrev != NULL);
            int iBitShift = (i + 1) * pCexState->nPis + Gia_ManPiNum(p);
            Gia_ManForEachRi( p, pObj, k )
            {
                if ( fEqual && pCexPrev && (int)pObj->fMark1 != Abc_InfoHasBit(pCexPrev->pData, iBitShift + k) )
                    fEqual = 0;
                if ( !pObj->fMark1 )
                {
                    fChanges = 1;
                    Abc_InfoXorBit( pNew->pData, iBitShift + k );
                }
            }
            if ( !fChanges || fEqual )
            {
                if ( pfEqual )
                    *pfEqual = fEqual;
                Abc_CexFree( pNew );
                return NULL;
            }
        }
/*
        if ( i == 20 )
        {
            printf( "Frame %d : ", i );
            Gia_ManForEachRi( p, pObj, k )
                printf( "%d", pObj->fMark1 );
            printf( "\n" );
        }
*/
    }
    return pNew;
}